

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_J_Test::TestBody(PhPacker_Arg_J_Test *this)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  string local_a8;
  uint local_84;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  uint64_t expected;
  any local_48;
  unsigned_long local_38;
  uint64_t result;
  string str;
  PhPacker_Arg_J_Test *this_local;
  
  str.field_2._8_8_ = this;
  PhPacker::pack<unsigned_long,_0>((string *)&result,'J',0xf42329fe0);
  PhPacker::unpack((PhPacker *)&local_48,'J',(string *)&result);
  uVar2 = std::any_cast<unsigned_long>(&local_48);
  std::any::~any(&local_48);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xf42329fe0;
  local_38 = uVar2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_70,"result","expected",&local_38,(unsigned_long *)&gtest_ar.message_)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x11b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (local_84 == 0) {
    PhPacker::pack<unsigned_long,_0>(&local_a8,'J',0x41);
    std::__cxx11::string::operator=((string *)&result,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    PhPacker::unpack((PhPacker *)&gtest_ar_1.message_,'J',(string *)&result);
    local_38 = std::any_cast<unsigned_long>((any *)&gtest_ar_1.message_);
    std::any::~any((any *)&gtest_ar_1.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x41;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_c8,"result","expected",&local_38,
               (unsigned_long *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x120,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message(&local_d0);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (local_84 == 0) {
      uVar2 = std::numeric_limits<unsigned_long>::min();
      PhPacker::pack<unsigned_long,_0>(&local_f8,'J',uVar2);
      std::__cxx11::string::operator=((string *)&result,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      PhPacker::unpack((PhPacker *)&gtest_ar_2.message_,'J',(string *)&result);
      local_38 = std::any_cast<unsigned_long>((any *)&gtest_ar_2.message_);
      std::any::~any((any *)&gtest_ar_2.message_);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )std::numeric_limits<unsigned_long>::min();
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_118,"result","expected",&local_38,
                 (unsigned_long *)&gtest_ar.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0x125,pcVar3);
        testing::internal::AssertHelper::operator=(&local_128,&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        testing::Message::~Message(&local_120);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (local_84 == 0) {
        uVar2 = std::numeric_limits<unsigned_long>::max();
        PhPacker::pack<unsigned_long,_0>(&local_148,'J',uVar2);
        std::__cxx11::string::operator=((string *)&result,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        PhPacker::unpack((PhPacker *)&gtest_ar_3.message_,'J',(string *)&result);
        local_38 = std::any_cast<unsigned_long>((any *)&gtest_ar_3.message_);
        std::any::~any((any *)&gtest_ar_3.message_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )std::numeric_limits<unsigned_long>::max();
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_168,"result","expected",&local_38,
                   (unsigned_long *)&gtest_ar.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar1) {
          testing::Message::Message(&local_170);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                     ,0x12a,pcVar3);
          testing::internal::AssertHelper::operator=(&local_178,&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          testing::Message::~Message(&local_170);
        }
        local_84 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
        if (local_84 == 0) {
          local_84 = 0;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

TEST(PhPacker, Arg_J)
{
   std::string str = PhPacker::pack<uint64_t>('J', 65535123424ull);
   uint64_t result = std::any_cast<uint64_t>(PhPacker::unpack('J', str));
   uint64_t expected = 65535123424ull;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint64_t>('J', 65ull);
   result = std::any_cast<uint64_t>(PhPacker::unpack('J', str));
   expected = 65;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint64_t>('J', std::numeric_limits<uint64_t>::min());
   result = std::any_cast<uint64_t>(PhPacker::unpack('J', str));
   expected = std::numeric_limits<uint64_t>::min();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint64_t>('J', std::numeric_limits<uint64_t>::max());
   result = std::any_cast<uint64_t>(PhPacker::unpack('J', str));
   expected = std::numeric_limits<uint64_t>::max();
   GTEST_ASSERT_EQ(result, expected);
}